

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::QueryProcessor(SystemInformationImplementation *this)

{
  bool bVar1;
  SystemInformationImplementation *this_local;
  
  bVar1 = QueryProcessorBySysconf(this);
  return bVar1;
}

Assistant:

bool SystemInformationImplementation::QueryProcessor()
{
  return this->QueryProcessorBySysconf();
}